

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O1

void __thiscall pstack::Dwarf::Ranges::Ranges(Ranges *this,DIE *die,uintmax_t base)

{
  iterator __position;
  exception eVar1;
  int iVar2;
  uintmax_t uVar3;
  uintmax_t uVar4;
  undefined4 extraout_var;
  Exception *pEVar5;
  long extraout_RDX;
  long extraout_RDX_00;
  ulong len;
  bool bVar6;
  uintmax_t uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 local_260 [8];
  DWARFReader reader;
  undefined1 local_c0 [8];
  Attribute ranges;
  element_type *peStack_88;
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_78;
  Object *local_70;
  undefined1 auStack_68 [8];
  DWARFReader r;
  uintmax_t local_38;
  uintmax_t end;
  
  (this->
  super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  r._32_8_ = this;
  DIE::attribute((Attribute *)local_c0,die,DW_AT_ranges,false);
  if (((die->unit).super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      version < 5) {
    Elf::Section::io((Section *)&ranges.formp);
    local_260 = (undefined1  [8])
                DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)local_c0);
    reader.off = (**(code **)(*(long *)ranges.formp + 0x40))();
    reader.end = (Off)ranges.formp;
    reader.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peStack_88;
    ranges.formp = (FormEntry *)0x0;
    reader.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._0_4_ = 8;
    do {
      uVar3 = DWARFReader::getuint((DWARFReader *)local_260,8);
      uVar4 = DWARFReader::getuint((DWARFReader *)local_260,8);
      uVar7 = base;
      if ((uVar4 != 0 || uVar3 != 0) && (uVar7 = uVar4, uVar3 != 0xffffffffffffffff)) {
        auStack_68 = (undefined1  [8])(uVar3 + base);
        r.off = uVar4 + base;
        __position._M_current = *(pair<unsigned_long,_unsigned_long> **)(r._32_8_ + 8);
        if (__position._M_current == *(pair<unsigned_long,_unsigned_long> **)(r._32_8_ + 0x10)) {
          std::
          vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                    ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                      *)r._32_8_,__position,(pair<unsigned_long,_unsigned_long> *)auStack_68);
          uVar7 = base;
        }
        else {
          (__position._M_current)->first = (unsigned_long)auStack_68;
          (__position._M_current)->second = r.off;
          *(long *)(r._32_8_ + 8) = *(long *)(r._32_8_ + 8) + 0x10;
          uVar7 = base;
        }
      }
      base = uVar7;
    } while (uVar4 != 0 || uVar3 != 0);
  }
  else {
    Elf::Section::io((Section *)&local_80);
    auStack_68 = (undefined1  [8])
                 DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)local_c0);
    iVar2 = (*local_80->_vptr_Reader[8])();
    r.off = CONCAT44(extraout_var,iVar2);
    r.end = (Off)local_80;
    r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Stack_78._M_pi;
    local_80 = (element_type *)0x0;
    _Stack_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _0_4_ = 8;
    local_70 = (Object *)
               (die->unit).super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    len = (ulong)*(byte *)&(local_70->programHeaders)._M_t._M_impl;
    bVar6 = false;
    do {
      Reader::readObj<unsigned_char>((Reader *)r.end,(Off)auStack_68,local_260,1);
      auStack_68 = (undefined1  [8])((long)auStack_68 + 1);
      eVar1 = local_260[0];
      switch((ulong)local_260 & 0xff) {
      case 0:
        bVar6 = true;
        break;
      case 1:
        auVar9 = (**(code **)(*(long *)r.end + 0x18))();
        auStack_68 = (undefined1  [8])((long)auStack_68 + auVar9._8_8_);
        base = Unit::addrx((Unit *)local_70,auVar9._0_8_);
        break;
      case 2:
        (**(code **)(*(long *)r.end + 0x18))();
        auStack_68 = (undefined1  [8])((long)auStack_68 + extraout_RDX);
        (**(code **)(*(long *)r.end + 0x18))();
        auStack_68 = (undefined1  [8])((long)auStack_68 + extraout_RDX_00);
        pEVar5 = (Exception *)__cxa_allocate_exception(0x1a0);
        memset((Exception *)local_260,0,0x1a0);
        Exception::Exception((Exception *)local_260);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&reader,"DW_RLE_startx_endx is not handled",0x21);
        Exception::Exception(pEVar5,(Exception *)local_260);
        __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
      case 3:
        auVar9 = (**(code **)(*(long *)r.end + 0x18))();
        auStack_68 = (undefined1  [8])((long)auStack_68 + auVar9._8_8_);
        local_260 = (undefined1  [8])Unit::addrx((Unit *)local_70,auVar9._0_8_);
        auVar9 = (**(code **)(*(long *)r.end + 0x18))(r.end,auStack_68);
        auStack_68 = (undefined1  [8])((long)auStack_68 + auVar9._8_8_);
        local_38 = auVar9._0_8_ + (long)local_260;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)r._32_8_,(unsigned_long *)local_260,&local_38);
        break;
      case 4:
        auVar9 = (**(code **)(*(long *)r.end + 0x18))();
        auStack_68 = (undefined1  [8])((long)auStack_68 + auVar9._8_8_);
        auVar8 = (**(code **)(*(long *)r.end + 0x18))(r.end,auStack_68);
        auStack_68 = (undefined1  [8])((long)auStack_68 + auVar8._8_8_);
        local_260 = (undefined1  [8])(auVar9._0_8_ + base);
        local_38 = auVar8._0_8_ + base;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long,unsigned_long>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)r._32_8_,(unsigned_long *)local_260,&local_38);
        break;
      case 5:
        base = DWARFReader::getuint((DWARFReader *)auStack_68,len);
        break;
      case 6:
        local_260 = (undefined1  [8])DWARFReader::getuint((DWARFReader *)auStack_68,len);
        local_38 = DWARFReader::getuint((DWARFReader *)auStack_68,len);
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)r._32_8_,(unsigned_long *)local_260,&local_38);
        break;
      case 7:
        local_260 = (undefined1  [8])DWARFReader::getuint((DWARFReader *)auStack_68,len);
        auVar9 = (**(code **)(*(long *)r.end + 0x18))(r.end,auStack_68);
        auStack_68 = (undefined1  [8])((long)auStack_68 + auVar9._8_8_);
        local_38 = auVar9._0_8_ + (long)local_260;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)r._32_8_,(unsigned_long *)local_260,&local_38);
        break;
      default:
        pEVar5 = (Exception *)__cxa_allocate_exception(0x1a0);
        memset((Exception *)local_260,0,0x1a0);
        Exception::Exception((Exception *)local_260);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&reader,"unhandled DW_RLE_ entry ",0x18);
        std::ostream::operator<<(&reader,(uint)(byte)eVar1);
        Exception::Exception(pEVar5,(Exception *)local_260);
        __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
      }
      reader.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    } while (!bVar6);
  }
  if (reader.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               reader.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
  }
  DIE::~DIE((DIE *)local_c0);
  return;
}

Assistant:

Ranges::Ranges(const DIE &die, uintmax_t base) {

    auto ranges = die.attribute(DW_AT_ranges);

    if (die.getUnit()->version < 5) {
        // DWARF4 units use debug_ranges
        DWARFReader reader(die.getUnit()->dwarf->debugRanges.io(), uintmax_t(ranges));
        for (;;) {
            auto start = reader.getuint(sizeof (Elf::Addr));
            auto end = reader.getuint(sizeof (Elf::Addr));
            if (start == 0 && end == 0)
                break;
            if (start == std::numeric_limits<Elf::Addr>::max())
                base = end;
            else
                emplace_back(std::make_pair(start + base, end + base));
        }
    } else {
        DWARFReader r(die.getUnit()->dwarf->debugRangelists.io(), uintmax_t(ranges));

        // const auto &elf = die.getUnit()->dwarf->elf;
        // auto &addrs = elf->getDebugSection(".debug_addr", SHT_NULL); // XXX: would be used by the "x" ops below

        auto addrlen = die.getUnit()->addrlen;
        auto &unit = *die.getUnit();
        for (bool done = false; !done;) {
            auto entryType = DW_RLE(r.getu8());
            switch (entryType) {
                case DW_RLE_end_of_list:
                    done = true;
                    break;

                case DW_RLE_base_addressx: {
                    auto baseidx = r.getuleb128();
                    base = unit.addrx(baseidx);
                    break;
                }

                case DW_RLE_startx_endx: {
                    /* auto startx = */ r.getuleb128();
                    /* auto endx = */ r.getuleb128();
                    throw (Exception() << "DW_RLE_startx_endx is not handled");
                }

                case DW_RLE_startx_length: {
                    auto start = unit.addrx(r.getuleb128());
                    auto len = r.getuleb128();
                    emplace_back(start, start + len);
                    break;
                }

                case DW_RLE_offset_pair: {
                    auto offstart = r.getuleb128();
                    auto offend = r.getuleb128();
                    emplace_back(offstart + base, offend + base);
                    break;
                }

                case DW_RLE_base_address:
                    base = r.getuint(addrlen);
                    break;

                case DW_RLE_start_end: {
                    auto start = r.getuint(addrlen);
                    auto end = r.getuint(addrlen);
                    emplace_back(start, end);
                    break;
                }
                case DW_RLE_start_length: {
                    auto start = r.getuint(addrlen);
                    auto len = r.getuleb128();
                    emplace_back(start, start + len);
                    break;
                }
                default:
                    throw (Exception() << "unhandled DW_RLE_ entry " << entryType);
            }
        }
    }
}